

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O1

FT_Error pfr_extra_item_load_stem_snaps(FT_Byte *p,FT_Byte *limit,PFR_PhyFont phy_font)

{
  FT_Byte *pFVar1;
  uint in_EAX;
  FT_Int *pFVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uStack_38;
  FT_Error error;
  
  uStack_38 = (ulong)in_EAX;
  if ((phy_font->vertical).stem_snaps == (FT_Int *)0x0) {
    pFVar1 = p + 1;
    if (pFVar1 <= limit) {
      uVar5 = *p & 0xf;
      uVar4 = (*p >> 4) + uVar5;
      if (pFVar1 + (ulong)uVar4 * 2 <= limit) {
        pFVar2 = (FT_Int *)
                 ft_mem_realloc(phy_font->memory,4,0,(ulong)uVar4,(void *)0x0,
                                (FT_Error *)((long)&uStack_38 + 4));
        if (uStack_38._4_4_ == 0) {
          (phy_font->vertical).stem_snaps = pFVar2;
          (phy_font->horizontal).stem_snaps = pFVar2 + uVar5;
          if (uVar4 != 0) {
            lVar3 = 0;
            do {
              pFVar2[lVar3] = (int)(short)((ushort)pFVar1[lVar3 * 2] << 8) | (uint)p[lVar3 * 2 + 2];
              lVar3 = lVar3 + 1;
            } while ((uint)lVar3 != uVar4);
          }
        }
        goto LAB_002072d1;
      }
    }
    uStack_38 = 0x800000000;
  }
LAB_002072d1:
  return uStack_38._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_extra_item_load_stem_snaps( FT_Byte*     p,
                                  FT_Byte*     limit,
                                  PFR_PhyFont  phy_font )
  {
    FT_UInt    count, num_vert, num_horz;
    FT_Int*    snaps  = NULL;
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = phy_font->memory;


    if ( phy_font->vertical.stem_snaps )
      goto Exit;

    PFR_CHECK( 1 );
    count = PFR_NEXT_BYTE( p );

    num_vert = count & 15;
    num_horz = count >> 4;
    count    = num_vert + num_horz;

    PFR_CHECK( count * 2 );

    if ( FT_NEW_ARRAY( snaps, count ) )
      goto Exit;

    phy_font->vertical.stem_snaps = snaps;
    phy_font->horizontal.stem_snaps = snaps + num_vert;

    for ( ; count > 0; count--, snaps++ )
      *snaps = FT_NEXT_SHORT( p );

  Exit:
    return error;

  Too_Short:
    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_extra_item_load_stem_snaps:"
               " invalid stem snaps table\n" ));
    goto Exit;
  }